

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int StrReplaceWalker(jx9_value *pKey,jx9_value *pData,void *pUserData)

{
  char *pDest;
  char *zDup;
  char *pcStack_48;
  int nByte;
  char *zIn;
  SyString sWorker;
  str_replace_data *pRep;
  void *pUserData_local;
  jx9_value *pData_local;
  jx9_value *pKey_local;
  
  sWorker._8_8_ = pUserData;
  pcStack_48 = jx9_value_to_string(pData,(int *)((long)&zDup + 4));
  zIn = (char *)0x0;
  sWorker.zString._0_4_ = 0;
  if (0 < (int)zDup._4_4_) {
    pDest = (char *)jx9_context_alloc_chunk(*(jx9_context **)(sWorker._8_8_ + 0x18),zDup._4_4_,0,1);
    if (pDest == (char *)0x0) {
      jx9_context_throw_error
                (*(jx9_context **)(sWorker._8_8_ + 0x18),1,"JX9 is running out of memory");
      return 0;
    }
    SyMemcpy(pcStack_48,pDest,zDup._4_4_);
    sWorker.zString._0_4_ = zDup._4_4_;
    zIn = pDest;
  }
  SySetPut(*(SySet **)(sWorker._8_8_ + 0x10),&zIn);
  return 0;
}

Assistant:

static int StrReplaceWalker(jx9_value *pKey, jx9_value *pData, void *pUserData)
{
	str_replace_data *pRep = (str_replace_data *)pUserData;
	SyString sWorker;
	const char *zIn;
	int nByte;
	/* Extract a string representation of the given argument */
	zIn = jx9_value_to_string(pData, &nByte);
	SyStringInitFromBuf(&sWorker, 0, 0);
	if( nByte > 0 ){
		char *zDup;
		/* Duplicate the chunk */
		zDup = (char *)jx9_context_alloc_chunk(pRep->pCtx, (unsigned int)nByte, FALSE, 
			TRUE /* Release the chunk automatically, upon this context is destroyd */
			);
		if( zDup == 0 ){
			/* Ignore any memory failure problem */
			jx9_context_throw_error(pRep->pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			return JX9_OK;
		}
		SyMemcpy(zIn, zDup, (sxu32)nByte);
		/* Save the chunk */
		SyStringInitFromBuf(&sWorker, zDup, nByte);
	}
	/* Save for later processing */
	SySetPut(pRep->pCollector, (const void *)&sWorker);
	/* All done */
	SXUNUSED(pKey); /* cc warning */
	return JX9_OK;
}